

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImGuiContext_conflict1 *pIVar1;
  ImGuiID id;
  size_t data_size;
  
  data_size = (long)str_end - (long)str;
  if (str_end == (char *)0x0) {
    data_size = 0;
  }
  id = ImHashStr(str,data_size,seed);
  pIVar1 = GImGui;
  if (GImGui->ActiveId == id) {
    GImGui->ActiveIdIsAlive = id;
  }
  if (pIVar1->ActiveIdPreviousFrame == id) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  if (pIVar1->DebugHookIdInfo == id) {
    DebugHookIdInfo(id,0xb,str,str_end);
  }
  return id;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
    return id;
}